

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O2

bool __thiscall ritobin::io::impl_text_read::TextReader::read_hash(TextReader *this,FNV1a *value)

{
  bool bVar1;
  char *pcVar2;
  string_view sVar3;
  string_view str;
  uint32_t result;
  undefined1 local_40 [8];
  _Alloc_hider local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  sVar3 = read_word(this);
  pcVar2 = sVar3._M_str;
  if (((sVar3._M_len < 2) || (*pcVar2 != '0')) || ((byte)(pcVar2[1] | 0x20U) != 0x78)) {
    bVar1 = false;
  }
  else {
    result = 0;
    str._M_str = (char *)&result;
    str._M_len = (size_t)(pcVar2 + 2);
    bVar1 = to_num<unsigned_int>((ritobin *)(sVar3._M_len - 2),str,(uint *)0x10,(int)&result);
    if (bVar1) {
      local_40._0_4_ = result;
      local_38._M_p = (pointer)&local_28;
      local_30 = 0;
      local_28._M_local_buf[0] = '\0';
      FNV1a::operator=(value,(FNV1a *)local_40);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  return bVar1;
}

Assistant:

bool read_hash(FNV1a& value) noexcept {
            auto const word = read_word();
            if (word.size() < 2) {
                return false;
            }
            if (word[0] != '0' || (word[1] != 'x' && word[1] != 'X')) {
                return false;
            }
            uint32_t result = 0;
            if (to_num({word.data() + 2, word.size() - 2}, result, 16)) {
                value = FNV1a{ result };
                return true;
            }
            return false;
        }